

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O1

BoxList * __thiscall amrex::BoxArray::boxList(BoxList *__return_storage_ptr__,BoxArray *this)

{
  pointer *ppBVar1;
  long *plVar2;
  BATType BVar3;
  element_type *peVar4;
  iterator iVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  int aiVar12 [3];
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  int dir_1;
  uint uVar18;
  uint uVar19;
  long lVar20;
  int iVar21;
  Box *__args;
  long lVar22;
  int iVar23;
  ulong uVar24;
  IntVect IVar25;
  Box result;
  Box bx;
  undefined8 local_a8;
  uint uStack_a0;
  uint auStack_9c [2];
  undefined8 uStack_94;
  Box local_88;
  element_type *local_60;
  int local_54 [3];
  int local_48 [3];
  ulong local_38;
  
  peVar4 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar24 = ((long)*(pointer *)
                   ((long)&(peVar4->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data + 8) -
            *(long *)&(peVar4->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data >> 2) * 0x6db6db6db6db6db7;
  BoxList::BoxList(__return_storage_ptr__);
  iVar23 = (int)uVar24;
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::reserve
            ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)__return_storage_ptr__,(long)iVar23)
  ;
  if (iVar23 < 1) {
    return __return_storage_ptr__;
  }
  BVar3 = (this->m_bat).m_bat_type;
  uVar18 = 0;
  switch(BVar3) {
  case null:
  case coarsenRatio:
    break;
  case indexType:
  case indexType_coarsenRatio:
    uVar18 = (this->m_bat).m_op.m_indexType.m_typ.itype;
    break;
  default:
    uVar18 = (this->m_bat).m_op.m_bndryReg.m_typ.itype;
  }
  (__return_storage_ptr__->btype).itype = uVar18;
  local_60 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  switch(BVar3) {
  case null:
    uVar17 = 1;
    if (1 < iVar23) {
      uVar17 = uVar24 & 0xffffffff;
    }
    lVar20 = 0;
    do {
      __args = (Box *)(*(long *)&(local_60->m_abox).
                                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                                 .super__Vector_impl_data + lVar20);
      iVar5._M_current =
           (__return_storage_ptr__->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (__return_storage_ptr__->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
                  ((vector<amrex::Box,std::allocator<amrex::Box>> *)__return_storage_ptr__,iVar5,
                   __args);
      }
      else {
        uVar7 = *(undefined8 *)(__args->smallend).vect;
        uVar8 = *(undefined8 *)((__args->smallend).vect + 2);
        uVar9 = *(undefined8 *)((__args->bigend).vect + 2);
        *(undefined8 *)((iVar5._M_current)->bigend).vect = *(undefined8 *)(__args->bigend).vect;
        *(undefined8 *)(((iVar5._M_current)->bigend).vect + 2) = uVar9;
        *(undefined8 *)((iVar5._M_current)->smallend).vect = uVar7;
        *(undefined8 *)(((iVar5._M_current)->smallend).vect + 2) = uVar8;
        ppBVar1 = &(__return_storage_ptr__->m_lbox).
                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppBVar1 = *ppBVar1 + 1;
      }
      lVar20 = lVar20 + 0x1c;
    } while (uVar17 * 0x1c != lVar20);
    return __return_storage_ptr__;
  case indexType:
  case indexType_coarsenRatio:
    uVar18 = *(uint *)&(this->m_bat).m_op;
    break;
  case coarsenRatio:
    uVar18 = 0;
    break;
  case bndryReg:
    uVar17 = 1;
    if (1 < iVar23) {
      uVar17 = uVar24 & 0xffffffff;
    }
    lVar20 = 0;
    do {
      BATbndryReg::operator()
                (&local_88,&(this->m_bat).m_op.m_bndryReg,
                 (Box *)(*(long *)&(local_60->m_abox).
                                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data + lVar20));
      iVar5._M_current =
           (__return_storage_ptr__->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (__return_storage_ptr__->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
                  ((vector<amrex::Box,std::allocator<amrex::Box>> *)__return_storage_ptr__,iVar5,
                   &local_88);
      }
      else {
        *(ulong *)((iVar5._M_current)->bigend).vect =
             CONCAT44(local_88.bigend.vect[1],local_88.bigend.vect[0]);
        *(ulong *)(((iVar5._M_current)->bigend).vect + 2) =
             CONCAT44(local_88.btype.itype,local_88.bigend.vect[2]);
        *(undefined8 *)((iVar5._M_current)->smallend).vect = local_88.smallend.vect._0_8_;
        *(ulong *)(((iVar5._M_current)->smallend).vect + 2) =
             CONCAT44(local_88.bigend.vect[0],local_88.smallend.vect[2]);
        ppBVar1 = &(__return_storage_ptr__->m_lbox).
                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppBVar1 = *ppBVar1 + 1;
      }
      lVar20 = lVar20 + 0x1c;
    } while (uVar17 * 0x1c != lVar20);
    return __return_storage_ptr__;
  default:
    uVar18 = *(uint *)((long)&(this->m_bat).m_op + 4);
  }
  IVar25 = BATransformer::coarsen_ratio(&this->m_bat);
  iVar21 = IVar25.vect[2];
  local_48[0] = IVar25.vect[0];
  local_48[1] = IVar25.vect[1];
  local_48[2] = IVar25.vect[2];
  aiVar12 = local_48;
  iVar14 = IVar25.vect[0];
  local_48[1] = IVar25.vect[1];
  iVar13 = local_48[1];
  bVar6 = local_48[1] != 1;
  local_38 = uVar24 & 0xffffffff;
  if (iVar23 < 2) {
    local_38 = 1;
  }
  uVar24 = 0;
  local_48 = aiVar12;
  do {
    lVar20 = *(long *)&(local_60->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data;
    plVar2 = (long *)(lVar20 + uVar24 * 0x1c);
    lVar22 = *plVar2;
    lVar10 = plVar2[1];
    plVar2 = (long *)(lVar20 + 0xc + uVar24 * 0x1c);
    lVar20 = *plVar2;
    lVar11 = plVar2[1];
    auStack_9c[1] = (uint)((ulong)lVar20 >> 0x20);
    uStack_94 = lVar11;
    uStack_a0 = (uint)lVar10;
    auStack_9c[0] = (uint)((ulong)lVar10 >> 0x20);
    local_a8 = lVar22;
    if (iVar21 != 1 || (bVar6 || iVar14 != 1)) {
      local_a8._0_4_ = (uint)lVar22;
      if (iVar14 != 1) {
        if (iVar14 == 4) {
          if ((int)(uint)local_a8 < 0) {
            local_a8._0_4_ = (uint)local_a8 + 1;
            uVar16 = -(uint)local_a8;
            if (0 < (int)(uint)local_a8) {
              uVar16 = (uint)local_a8;
            }
            uVar16 = uVar16 >> 2;
LAB_005671aa:
            local_a8._0_4_ = ~uVar16;
          }
          else {
            local_a8._0_4_ = (uint)local_a8 >> 2;
          }
        }
        else if (iVar14 == 2) {
          if ((int)(uint)local_a8 < 0) {
            local_a8._0_4_ = (uint)local_a8 + 1;
            uVar16 = -(uint)local_a8;
            if (0 < (int)(uint)local_a8) {
              uVar16 = (uint)local_a8;
            }
            uVar16 = uVar16 >> 1;
            goto LAB_005671aa;
          }
          local_a8._0_4_ = (uint)local_a8 >> 1;
        }
        else if ((int)(uint)local_a8 < 0) {
          iVar15 = (uint)local_a8 + 1;
          iVar23 = -iVar15;
          if (0 < iVar15) {
            iVar23 = iVar15;
          }
          local_a8._0_4_ = ~(iVar23 / iVar14);
        }
        else {
          local_a8._0_4_ = (int)(uint)local_a8 / iVar14;
        }
      }
      local_a8._4_4_ = (uint)((ulong)lVar22 >> 0x20);
      if (iVar13 != 1) {
        if (iVar13 == 4) {
          if (lVar22 < 0) {
            local_a8._4_4_ = local_a8._4_4_ + 1;
            uVar16 = -local_a8._4_4_;
            if (0 < (int)local_a8._4_4_) {
              uVar16 = local_a8._4_4_;
            }
            uVar16 = uVar16 >> 2;
LAB_0056720f:
            local_a8._4_4_ = ~uVar16;
          }
          else {
            local_a8._4_4_ = local_a8._4_4_ >> 2;
          }
        }
        else if (iVar13 == 2) {
          if (lVar22 < 0) {
            local_a8._4_4_ = local_a8._4_4_ + 1;
            uVar16 = -local_a8._4_4_;
            if (0 < (int)local_a8._4_4_) {
              uVar16 = local_a8._4_4_;
            }
            uVar16 = uVar16 >> 1;
            goto LAB_0056720f;
          }
          local_a8._4_4_ = local_a8._4_4_ >> 1;
        }
        else if (lVar22 < 0) {
          iVar15 = local_a8._4_4_ + 1;
          iVar23 = -iVar15;
          if (0 < iVar15) {
            iVar23 = iVar15;
          }
          local_a8._4_4_ = ~(iVar23 / iVar13);
        }
        else {
          local_a8._4_4_ = (int)local_a8._4_4_ / iVar13;
        }
      }
      if (iVar21 != 1) {
        if (iVar21 == 4) {
          if ((int)uStack_a0 < 0) {
            uStack_a0 = uStack_a0 + 1;
            uVar16 = -uStack_a0;
            if (0 < (int)uStack_a0) {
              uVar16 = uStack_a0;
            }
            uVar16 = uVar16 >> 2;
LAB_00567270:
            uStack_a0 = ~uVar16;
          }
          else {
            uStack_a0 = uStack_a0 >> 2;
          }
        }
        else if (iVar21 == 2) {
          if ((int)uStack_a0 < 0) {
            uStack_a0 = uStack_a0 + 1;
            uVar16 = -uStack_a0;
            if (0 < (int)uStack_a0) {
              uVar16 = uStack_a0;
            }
            uVar16 = uVar16 >> 1;
            goto LAB_00567270;
          }
          uStack_a0 = uStack_a0 >> 1;
        }
        else if ((int)uStack_a0 < 0) {
          iVar15 = uStack_a0 + 1;
          iVar23 = -iVar15;
          if (0 < iVar15) {
            iVar23 = iVar15;
          }
          uStack_a0 = ~(iVar23 / iVar21);
        }
        else {
          uStack_a0 = (int)uStack_a0 / iVar21;
        }
      }
      uStack_94._4_4_ = (uint)((ulong)lVar11 >> 0x20);
      uStack_94._0_4_ = (uint)lVar11;
      if (uStack_94._4_4_ == 0) {
        if (iVar14 != 1) {
          if (iVar14 == 4) {
            if (lVar10 < 0) {
              auStack_9c[0] = auStack_9c[0] + 1;
              uVar16 = -auStack_9c[0];
              if (0 < (int)auStack_9c[0]) {
                uVar16 = auStack_9c[0];
              }
              uVar16 = uVar16 >> 2;
LAB_00567534:
              auStack_9c[0] = ~uVar16;
            }
            else {
              auStack_9c[0] = auStack_9c[0] >> 2;
            }
          }
          else if (iVar14 == 2) {
            if (lVar10 < 0) {
              auStack_9c[0] = auStack_9c[0] + 1;
              uVar16 = -auStack_9c[0];
              if (0 < (int)auStack_9c[0]) {
                uVar16 = auStack_9c[0];
              }
              uVar16 = uVar16 >> 1;
              goto LAB_00567534;
            }
            auStack_9c[0] = auStack_9c[0] >> 1;
          }
          else if (lVar10 < 0) {
            iVar15 = auStack_9c[0] + 1;
            iVar23 = -iVar15;
            if (0 < iVar15) {
              iVar23 = iVar15;
            }
            auStack_9c[0] = ~(iVar23 / iVar14);
          }
          else {
            auStack_9c[0] = (int)auStack_9c[0] / iVar14;
          }
        }
        if (iVar13 != 1) {
          if (iVar13 == 4) {
            if (lVar20 < 0) {
              auStack_9c[1] = auStack_9c[1] + 1;
              uVar16 = -auStack_9c[1];
              if (0 < (int)auStack_9c[1]) {
                uVar16 = auStack_9c[1];
              }
              uVar16 = uVar16 >> 2;
LAB_00567599:
              auStack_9c[1] = ~uVar16;
            }
            else {
              auStack_9c[1] = auStack_9c[1] >> 2;
            }
          }
          else if (iVar13 == 2) {
            if (lVar20 < 0) {
              auStack_9c[1] = auStack_9c[1] + 1;
              uVar16 = -auStack_9c[1];
              if (0 < (int)auStack_9c[1]) {
                uVar16 = auStack_9c[1];
              }
              uVar16 = uVar16 >> 1;
              goto LAB_00567599;
            }
            auStack_9c[1] = auStack_9c[1] >> 1;
          }
          else if (lVar20 < 0) {
            iVar15 = auStack_9c[1] + 1;
            iVar23 = -iVar15;
            if (0 < iVar15) {
              iVar23 = iVar15;
            }
            auStack_9c[1] = ~(iVar23 / iVar13);
          }
          else {
            auStack_9c[1] = (int)auStack_9c[1] / iVar13;
          }
        }
        if (iVar21 != 1) {
          if (iVar21 == 4) {
            if ((int)(uint)uStack_94 < 0) {
              uStack_94._0_4_ = (uint)uStack_94 + 1;
              uVar16 = -(uint)uStack_94;
              if (0 < (int)(uint)uStack_94) {
                uVar16 = (uint)uStack_94;
              }
              uVar16 = uVar16 >> 2;
LAB_00567607:
              uStack_94._0_4_ = ~uVar16;
            }
            else {
              uStack_94._0_4_ = (uint)uStack_94 >> 2;
            }
          }
          else if (iVar21 == 2) {
            if ((int)(uint)uStack_94 < 0) {
              uStack_94._0_4_ = (uint)uStack_94 + 1;
              uVar16 = -(uint)uStack_94;
              if (0 < (int)(uint)uStack_94) {
                uVar16 = (uint)uStack_94;
              }
              uVar16 = uVar16 >> 1;
              goto LAB_00567607;
            }
            uStack_94._0_4_ = (uint)uStack_94 >> 1;
          }
          else if ((int)(uint)uStack_94 < 0) {
            iVar15 = (uint)uStack_94 + 1;
            iVar23 = -iVar15;
            if (0 < iVar15) {
              iVar23 = iVar15;
            }
            uStack_94._0_4_ = ~(iVar23 / iVar21);
          }
          else {
            uStack_94._0_4_ = (int)(uint)uStack_94 / iVar21;
          }
        }
      }
      else {
        local_54[0] = 0;
        local_54[1] = 0;
        local_54[2] = 0;
        lVar22 = 0;
        do {
          if (((uStack_94._4_4_ >> ((uint)lVar22 & 0x1f) & 1) != 0) &&
             ((int)auStack_9c[lVar22] % local_48[lVar22] != 0)) {
            local_54[lVar22] = 1;
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != 3);
        if (iVar14 != 1) {
          if (iVar14 == 4) {
            if (lVar10 < 0) {
              auStack_9c[0] = auStack_9c[0] + 1;
              uVar16 = -auStack_9c[0];
              if (0 < (int)auStack_9c[0]) {
                uVar16 = auStack_9c[0];
              }
              uVar16 = uVar16 >> 2;
LAB_00567365:
              auStack_9c[0] = ~uVar16;
            }
            else {
              auStack_9c[0] = auStack_9c[0] >> 2;
            }
          }
          else if (iVar14 == 2) {
            if (lVar10 < 0) {
              auStack_9c[0] = auStack_9c[0] + 1;
              uVar16 = -auStack_9c[0];
              if (0 < (int)auStack_9c[0]) {
                uVar16 = auStack_9c[0];
              }
              uVar16 = uVar16 >> 1;
              goto LAB_00567365;
            }
            auStack_9c[0] = auStack_9c[0] >> 1;
          }
          else if (lVar10 < 0) {
            iVar15 = auStack_9c[0] + 1;
            iVar23 = -iVar15;
            if (0 < iVar15) {
              iVar23 = iVar15;
            }
            auStack_9c[0] = ~(iVar23 / iVar14);
          }
          else {
            auStack_9c[0] = (int)auStack_9c[0] / iVar14;
          }
        }
        if (iVar13 != 1) {
          if (iVar13 == 4) {
            if (lVar20 < 0) {
              auStack_9c[1] = auStack_9c[1] + 1;
              uVar16 = -auStack_9c[1];
              if (0 < (int)auStack_9c[1]) {
                uVar16 = auStack_9c[1];
              }
              uVar16 = uVar16 >> 2;
LAB_005673cc:
              auStack_9c[1] = ~uVar16;
            }
            else {
              auStack_9c[1] = auStack_9c[1] >> 2;
            }
          }
          else if (iVar13 == 2) {
            if (lVar20 < 0) {
              auStack_9c[1] = auStack_9c[1] + 1;
              uVar16 = -auStack_9c[1];
              if (0 < (int)auStack_9c[1]) {
                uVar16 = auStack_9c[1];
              }
              uVar16 = uVar16 >> 1;
              goto LAB_005673cc;
            }
            auStack_9c[1] = auStack_9c[1] >> 1;
          }
          else if (lVar20 < 0) {
            iVar15 = auStack_9c[1] + 1;
            iVar23 = -iVar15;
            if (0 < iVar15) {
              iVar23 = iVar15;
            }
            auStack_9c[1] = ~(iVar23 / iVar13);
          }
          else {
            auStack_9c[1] = (int)auStack_9c[1] / iVar13;
          }
        }
        if (iVar21 != 1) {
          if (iVar21 == 4) {
            if ((int)(uint)uStack_94 < 0) {
              uStack_94._0_4_ = (uint)uStack_94 + 1;
              uVar16 = -(uint)uStack_94;
              if (0 < (int)(uint)uStack_94) {
                uVar16 = (uint)uStack_94;
              }
              uVar16 = uVar16 >> 2;
LAB_0056742d:
              uStack_94._0_4_ = ~uVar16;
            }
            else {
              uStack_94._0_4_ = (uint)uStack_94 >> 2;
            }
          }
          else if (iVar21 == 2) {
            if ((int)(uint)uStack_94 < 0) {
              uStack_94._0_4_ = (uint)uStack_94 + 1;
              uVar16 = -(uint)uStack_94;
              if (0 < (int)(uint)uStack_94) {
                uVar16 = (uint)uStack_94;
              }
              uVar16 = uVar16 >> 1;
              goto LAB_0056742d;
            }
            uStack_94._0_4_ = (uint)uStack_94 >> 1;
          }
          else if ((int)(uint)uStack_94 < 0) {
            iVar15 = (uint)uStack_94 + 1;
            iVar23 = -iVar15;
            if (0 < iVar15) {
              iVar23 = iVar15;
            }
            uStack_94._0_4_ = ~(iVar23 / iVar21);
          }
          else {
            uStack_94._0_4_ = (int)(uint)uStack_94 / iVar21;
          }
        }
        auStack_9c[0] = auStack_9c[0] + local_54[0];
        auStack_9c[1] = auStack_9c[1] + local_54[1];
        uStack_94._0_4_ = (uint)uStack_94 + local_54[2];
      }
    }
    local_88.bigend.vect[1] = auStack_9c[1];
    local_88.bigend.vect[2] = (uint)uStack_94;
    local_88.btype.itype = uStack_94._4_4_;
    local_88.smallend.vect[0] = (uint)local_a8;
    local_88.smallend.vect[1] = local_a8._4_4_;
    local_88.smallend.vect[2] = uStack_a0;
    local_88.bigend.vect[0] = auStack_9c[0];
    lVar20 = 0;
    do {
      uVar16 = 1 << ((byte)lVar20 & 0x1f);
      uVar19 = (uint)lVar20;
      local_88.bigend.vect[lVar20] =
           (local_88.bigend.vect[lVar20] + (uint)((uVar18 >> (uVar19 & 0x1f) & 1) != 0)) -
           (uint)((local_88.btype.itype >> (uVar19 & 0x1f) & 1) != 0);
      if ((uVar18 >> (uVar19 & 0x1f) & 1) == 0) {
        local_88.btype.itype = ~uVar16 & local_88.btype.itype;
      }
      else {
        local_88.btype.itype = uVar16 | local_88.btype.itype;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    iVar5._M_current =
         (__return_storage_ptr__->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data
         ._M_finish;
    if (iVar5._M_current ==
        (__return_storage_ptr__->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
                ((vector<amrex::Box,std::allocator<amrex::Box>> *)__return_storage_ptr__,iVar5,
                 &local_88);
    }
    else {
      *(ulong *)((iVar5._M_current)->bigend).vect =
           CONCAT44(local_88.bigend.vect[1],local_88.bigend.vect[0]);
      *(ulong *)(((iVar5._M_current)->bigend).vect + 2) =
           CONCAT44(local_88.btype.itype,local_88.bigend.vect[2]);
      *(long *)((iVar5._M_current)->smallend).vect = local_a8;
      *(ulong *)(((iVar5._M_current)->smallend).vect + 2) =
           CONCAT44(local_88.bigend.vect[0],uStack_a0);
      ppBVar1 = &(__return_storage_ptr__->m_lbox).
                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppBVar1 = *ppBVar1 + 1;
    }
    uVar24 = uVar24 + 1;
    if (uVar24 == local_38) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

BoxList
BoxArray::boxList () const
{
    const int N = size();
    BoxList newb;
    newb.data().reserve(N);
    if (N > 0) {
        newb.set(ixType());
        auto const& bxs = this->m_ref->m_abox;
        if (m_bat.is_null()) {
            for (int i = 0; i < N; ++i) {
                newb.push_back(bxs[i]);
            }
        } else if (m_bat.is_simple()) {
            IndexType t = ixType();
            IntVect cr = crseRatio();
            for (int i = 0; i < N; ++i) {
                newb.push_back(amrex::convert(amrex::coarsen(bxs[i],cr),t));
            }
        } else {
            for (int i = 0; i < N; ++i) {
                newb.push_back(m_bat.m_op.m_bndryReg(bxs[i]));
            }
        }
    }
    return newb;
}